

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_posix.cpp
# Opt level: O2

void __thiscall
pstore::file::file_handle::write_buffer
          (file_handle *this,not_null<const_void_*> buffer,size_t nbytes)

{
  int err;
  ssize_t sVar1;
  int *piVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  ensure_open(this);
  sVar1 = write(this->file_,buffer.ptr_,nbytes);
  if (sVar1 == -1) {
    piVar2 = __errno_location();
    err = *piVar2;
    std::__cxx11::string::string((string *)&local_40,(string *)&this->path_);
    (anonymous_namespace)::raise_file_error<char_const*,std::__cxx11::string>
              (err,"write failed",&local_40);
  }
  if (this->is_writable_ != false) {
    return;
  }
  assert_failed("is_writable_",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/os/file_posix.cpp"
                ,0x140);
}

Assistant:

void file_handle::write_buffer (gsl::not_null<void const *> const buffer,
                                        std::size_t const nbytes) {
            this->ensure_open ();

            if (::write (file_, buffer.get (), nbytes) == -1) {
                int const err = errno;
                raise_file_error (err, "write failed", this->path ());
            }

            // If the write call succeeded, then the file must have been writable!
            PSTORE_ASSERT (is_writable_);
        }